

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_details.cxx
# Opt level: O0

bool __thiscall xray_re::xr_level_details::load_texture(xr_level_details *this,char *path)

{
  xr_reader *this_00;
  bool bVar1;
  reference ppxVar2;
  string *psVar3;
  reference ppxVar4;
  size_t sVar5;
  uint8_t *dest;
  xr_reader *local_78;
  xr_reader *r;
  xr_file_system *fs;
  __normal_iterator<xray_re::xr_dm_**,_std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>_>
  local_58;
  xr_dm_vec_it end;
  __normal_iterator<xray_re::xr_dm_**,_std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>_>
  local_48;
  xr_dm_vec_it it;
  string name;
  char *path_local;
  xr_level_details *this_local;
  
  bVar1 = std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>::empty(&this->m_models);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    ppxVar2 = std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>::operator[]
                        (&this->m_models,0);
    psVar3 = xr_dm::texture_abi_cxx11_(*ppxVar2);
    std::__cxx11::string::string((string *)&it,(string *)psVar3);
    end._M_current =
         (xr_dm **)
         std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>::begin(&this->m_models);
    local_48 = __gnu_cxx::
               __normal_iterator<xray_re::xr_dm_**,_std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>_>
               ::operator+(&end,1);
    local_58._M_current =
         (xr_dm **)
         std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>::end(&this->m_models);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&local_48,&local_58);
      if (!bVar1) break;
      ppxVar4 = __gnu_cxx::
                __normal_iterator<xray_re::xr_dm_**,_std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>_>
                ::operator*(&local_48);
      psVar3 = xr_dm::texture_abi_cxx11_(*ppxVar4);
      bVar1 = std::operator!=(psVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&it);
      if (bVar1) {
        this_local._7_1_ = false;
        goto LAB_001d091d;
      }
      __gnu_cxx::
      __normal_iterator<xray_re::xr_dm_**,_std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>_>
      ::operator++(&local_48);
    }
    std::__cxx11::string::operator+=((string *)&it,".dds");
    r = (xr_reader *)xr_file_system::instance();
    local_78 = xr_file_system::r_open((xr_file_system *)r,path,(string *)&it);
    if (local_78 == (xr_reader *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      sVar5 = xr_reader::size(local_78);
      this_00 = local_78;
      this->m_raw_texture_size = sVar5;
      dest = (uint8_t *)operator_new__(this->m_raw_texture_size);
      this->m_raw_texture = dest;
      xr_reader::r_raw(this_00,dest,this->m_raw_texture_size);
      xr_file_system::r_close((xr_file_system *)r,&local_78);
      this_local._7_1_ = true;
    }
LAB_001d091d:
    fs._0_4_ = 1;
    std::__cxx11::string::~string((string *)&it);
  }
  return this_local._7_1_;
}

Assistant:

bool xr_level_details::load_texture(const char* path)
{
	if (m_models.empty())
		return false;
	std::string name(m_models[0]->texture());
	for (xr_dm_vec_it it = m_models.begin() + 1, end = m_models.end(); it != end; ++it) {
		if ((*it)->texture() != name)
			return false;
	}
	name += ".dds";
#if 1
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path, name);
	if (r == 0)
		return false;
	m_raw_texture_size = r->size();
	r->r_raw(m_raw_texture = new uint8_t[m_raw_texture_size], m_raw_texture_size);
	fs.r_close(r);
	return true;
#else
	m_texture = new xr_image;
	if (m_texture->load_dds(path, name))
		return true;
	delete m_texture;
	m_texture = 0;
	return false;
#endif
}